

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O2

Var __thiscall Minisat::OnlineProofChecker::newVar(OnlineProofChecker *this)

{
  int iVar1;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  iVar1 = (this->assigns).sz;
  local_38._M_impl.super__Vector_impl_data._M_start._0_4_ = iVar1 * 2;
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_38);
  local_38._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_38._M_impl.super__Vector_impl_data._M_start._4_4_,iVar1 * 2 + 1);
  OccLists<Minisat::Lit,_Minisat::vec<Minisat::Watcher>,_Minisat::WatcherDeleted>::init
            (&this->watches,(EVP_PKEY_CTX *)&local_38);
  local_38._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_38._M_impl.super__Vector_impl_data._M_start._1_7_,2);
  vec<Minisat::lbool>::push(&this->assigns,(lbool *)&local_38);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->occ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
  ::emplace_back<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((vector<std::vector<unsigned_int,std::allocator<unsigned_int>>,std::allocator<std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              *)&this->occ,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_38);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_38);
  MarkArray::resize(&this->ma,
                    (int)((ulong)((long)(this->ma).array.
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)(this->ma).array.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) + 2);
  vec<Minisat::Lit>::capacity(&this->trail,iVar1 + 1);
  return iVar1;
}

Assistant:

inline Var OnlineProofChecker::newVar()
{
    int v = nVars();
    watches.init(mkLit(v, false));
    watches.init(mkLit(v, true));

    assigns.push(l_Undef);
    occ.push_back(std::vector<CRef>()); // there are no new clauses here yet
    occ.push_back(std::vector<CRef>());
    ma.resize(ma.size() + 2); // for each literal have a cell
    trail.capacity(v + 1);
    return v;
}